

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::MutablePatternModifier::apply
          (MutablePatternModifier *this,NumberStringBuilder *output,int32_t leftIndex,
          int32_t rightIndex,UErrorCode *status)

{
  NumberStringBuilder *this_00;
  uint uVar1;
  int __fdin;
  ssize_t sVar2;
  UnicodeString local_80;
  int local_3c;
  int32_t local_38;
  int32_t overwriteLen;
  int32_t suffixLen;
  int32_t prefixLen;
  MutablePatternModifier *nonConstThis;
  UErrorCode *status_local;
  int32_t rightIndex_local;
  int32_t leftIndex_local;
  NumberStringBuilder *output_local;
  MutablePatternModifier *this_local;
  
  _suffixLen = this;
  nonConstThis = (MutablePatternModifier *)status;
  status_local._0_4_ = rightIndex;
  status_local._4_4_ = leftIndex;
  _rightIndex_local = output;
  output_local = (NumberStringBuilder *)this;
  overwriteLen = insertPrefix(this,output,leftIndex,status);
  local_38 = insertSuffix(_suffixLen,_rightIndex_local,(int32_t)status_local + overwriteLen,
                          (UErrorCode *)nonConstThis);
  local_3c = 0;
  uVar1 = (*this->fPatternInfo->_vptr_AffixPatternProvider[10])();
  this_00 = _rightIndex_local;
  if ((uVar1 & 1) == 0) {
    __fdin = status_local._4_4_ + overwriteLen;
    uVar1 = (int32_t)status_local + overwriteLen;
    UnicodeString::UnicodeString(&local_80);
    sVar2 = NumberStringBuilder::splice
                      (this_00,__fdin,(__off64_t *)(ulong)uVar1,(int)&local_80,(__off64_t *)0x0,0,
                       0xb);
    local_3c = (int)sVar2;
    UnicodeString::~UnicodeString(&local_80);
  }
  CurrencySpacingEnabledModifier::applyCurrencySpacing
            (_rightIndex_local,status_local._4_4_,overwriteLen,
             (int32_t)status_local + local_3c + overwriteLen,local_38,this->fSymbols,
             (UErrorCode *)nonConstThis);
  return overwriteLen + local_3c + local_38;
}

Assistant:

int32_t MutablePatternModifier::apply(NumberStringBuilder& output, int32_t leftIndex, int32_t rightIndex,
                                      UErrorCode& status) const {
    // The unsafe code path performs self-mutation, so we need a const_cast.
    // This method needs to be const because it overrides a const method in the parent class.
    auto nonConstThis = const_cast<MutablePatternModifier*>(this);
    int32_t prefixLen = nonConstThis->insertPrefix(output, leftIndex, status);
    int32_t suffixLen = nonConstThis->insertSuffix(output, rightIndex + prefixLen, status);
    // If the pattern had no decimal stem body (like #,##0.00), overwrite the value.
    int32_t overwriteLen = 0;
    if (!fPatternInfo->hasBody()) {
        overwriteLen = output.splice(
                leftIndex + prefixLen,
                rightIndex + prefixLen,
                UnicodeString(),
                0,
                0,
                UNUM_FIELD_COUNT,
                status);
    }
    CurrencySpacingEnabledModifier::applyCurrencySpacing(
            output,
            leftIndex,
            prefixLen,
            rightIndex + overwriteLen + prefixLen,
            suffixLen,
            *fSymbols,
            status);
    return prefixLen + overwriteLen + suffixLen;
}